

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O2

unique_ptr<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>_>
 __thiscall pstore::index::details::linear_node::allocate(linear_node *this,address a,address b)

{
  linear_node *this_00;
  address *paVar1;
  
  this_00 = (linear_node *)::operator_new(0x20);
  linear_node(this_00,2);
  *(linear_node **)(this->signature_)._M_elems = this_00;
  paVar1 = operator[](this_00,0);
  paVar1->a_ = a.a_;
  paVar1 = operator[](this_00,1);
  paVar1->a_ = b.a_;
  return (__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
          )(__uniq_ptr_data<pstore::index::details::linear_node,_std::default_delete<pstore::index::details::linear_node>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<linear_node> linear_node::allocate (address const a, address const b) {
                auto result = std::unique_ptr<linear_node> (new (nchildren{2U}) linear_node (2U));
                (*result)[0] = a;
                (*result)[1] = b;
                return result;
            }